

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall QStandardItemPrivate::setModel(QStandardItemPrivate *this,QStandardItemModel *mod)

{
  QStandardItem *pQVar1;
  QStandardItemModel *pQVar2;
  QModelIndex *pQVar3;
  QStandardItemPrivate *pQVar4;
  pair<int,_int> pVar5;
  iterator iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  pair<int,_int> local_70;
  QStandardItem *local_68;
  QStandardItemModel *pQStack_60;
  pair<int,_int> local_58;
  QStandardItem *pQStack_50;
  QStandardItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->children).d.size == 0) {
    pQVar2 = this->model;
    if (pQVar2 != (QStandardItemModel *)0x0) {
      pQVar3 = *(QModelIndex **)&pQVar2->field_0x8;
      pQVar1 = this->q_ptr;
      if ((pQVar1 == (QStandardItem *)0x0) ||
         (pQVar4 = (pQVar1->d_ptr).d, pQVar4->parent == (QStandardItem *)0x0)) {
        local_58.first = -1;
        local_58.second = -1;
        pQStack_50 = (QStandardItem *)0x0;
        local_48 = (QStandardItemModel *)0x0;
      }
      else {
        local_58 = position(pQVar4);
        pQStack_50 = ((pQVar1->d_ptr).d)->parent;
        local_48 = pQVar2;
      }
      QAbstractItemModelPrivate::invalidatePersistentIndex(pQVar3);
    }
    this->model = mod;
  }
  else {
    local_58.first = 0;
    local_58.second = 0;
    pQStack_50 = (QStandardItem *)0x0;
    local_48 = (QStandardItemModel *)0x0;
    local_70 = (pair<int,_int>)this->q_ptr;
    QtPrivate::QPodArrayOps<QStandardItem*>::emplace<QStandardItem*&>
              ((QPodArrayOps<QStandardItem*> *)&local_58,0,(QStandardItem **)&local_70);
    QList<QStandardItem_*>::end((QList<QStandardItem_*> *)&local_58);
    if (local_48 != (QStandardItemModel *)0x0) {
      do {
        iVar6 = QList<QStandardItem_*>::end((QList<QStandardItem_*> *)&local_58);
        pQVar1 = iVar6.i[-1];
        local_48 = (QStandardItemModel *)&local_48[-1].field_0xf;
        pQVar2 = ((pQVar1->d_ptr).d)->model;
        if (pQVar2 != (QStandardItemModel *)0x0) {
          pQVar3 = *(QModelIndex **)&pQVar2->field_0x8;
          if ((pQVar1 == (QStandardItem *)0x0) ||
             (pQVar4 = (pQVar1->d_ptr).d, pQVar4->parent == (QStandardItem *)0x0)) {
            local_70.first = -1;
            local_70.second = -1;
            local_68 = (QStandardItem *)0x0;
            pQStack_60 = (QStandardItemModel *)0x0;
          }
          else {
            pQVar2 = pQVar4->model;
            local_70 = position(pQVar4);
            local_68 = ((pQVar1->d_ptr).d)->parent;
            pQStack_60 = pQVar2;
          }
          QAbstractItemModelPrivate::invalidatePersistentIndex(pQVar3);
        }
        pQVar4 = (pQVar1->d_ptr).d;
        pQVar4->model = mod;
        if ((pQVar4->children).d.size != 0) {
          uVar7 = 0;
          do {
            pVar5 = *(pair<int,_int> *)((pQVar4->children).d.ptr + uVar7);
            if (pVar5 != (pair<int,_int>)0x0) {
              local_70 = pVar5;
              QtPrivate::QPodArrayOps<QStandardItem*>::emplace<QStandardItem*&>
                        ((QPodArrayOps<QStandardItem*> *)&local_58,(qsizetype)local_48,
                         (QStandardItem **)&local_70);
              QList<QStandardItem_*>::end((QList<QStandardItem_*> *)&local_58);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < (ulong)(pQVar4->children).d.size);
        }
      } while (local_48 != (QStandardItemModel *)0x0);
    }
    if (local_58 != (pair<int,_int>)0x0) {
      LOCK();
      *(int *)local_58 = *(int *)local_58 + -1;
      UNLOCK();
      if (*(int *)local_58 == 0) {
        QArrayData::deallocate((QArrayData *)local_58,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::setModel(QStandardItemModel *mod)
{
    if (children.isEmpty()) {
        if (model)
            model->d_func()->invalidatePersistentIndex(model->indexFromItem(q_ptr));
        model = mod;
    } else {
        QStack<QStandardItem*> stack;
        stack.push(q_ptr);
        while (!stack.isEmpty()) {
            QStandardItem *itm = stack.pop();
            if (itm->d_func()->model) {
                itm->d_func()->model->d_func()->invalidatePersistentIndex(itm->d_func()->model->indexFromItem(itm));
            }
            itm->d_func()->model = mod;
            const QList<QStandardItem*> &childList = itm->d_func()->children;
            for (int i = 0; i < childList.size(); ++i) {
                QStandardItem *chi = childList.at(i);
                if (chi)
                    stack.push(chi);
            }
        }
    }
}